

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<5,_3,_4>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  long lVar1;
  Vector<float,_4> *in_RCX;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  undefined8 local_90;
  float local_88 [6];
  float local_70 [4];
  float local_60 [2];
  ulong local_58;
  undefined4 local_50;
  Vector<float,_3> local_48;
  float fStack_3c;
  Matrix<float,_3,_4> local_38;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_88[0] = (evalCtx->coords).m_data[2];
    local_90 = *(undefined8 *)(evalCtx->coords).m_data;
  }
  else {
    local_90 = 0x3dcccccd3f8ccccd;
    local_88[0] = 0.5;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_48.m_data[0] = (evalCtx->coords).m_data[0];
    local_48.m_data[1] = (evalCtx->coords).m_data[1];
    local_48.m_data[2] = (evalCtx->coords).m_data[2];
    fStack_3c = (evalCtx->coords).m_data[3];
  }
  else {
    local_48.m_data[0] = (float)0x3e4ccccd;
    local_48.m_data[1] = (float)0xbf800000;
    local_48.m_data[2] = (float)0x3f000000;
    fStack_3c = (float)0x3f4ccccd;
  }
  outerProduct<float,4,3>(&local_38,(MatrixCaseUtils *)&local_90,&local_48,in_RCX);
  local_70[2] = 0.0;
  local_70[0] = 0.0;
  local_70[1] = 0.0;
  lVar1 = 0;
  do {
    local_70[lVar1] =
         local_38.m_data.m_data[0].m_data[lVar1] + local_38.m_data.m_data[1].m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_58 = local_58 & 0xffffffff00000000;
  local_60[0] = 0.0;
  local_60[1] = 0.0;
  lVar1 = 0;
  do {
    local_60[lVar1] = local_70[lVar1] + local_38.m_data.m_data[2].m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_88[4] = 0.0;
  local_88[2] = 0.0;
  local_88[3] = 0.0;
  lVar1 = 0;
  do {
    local_88[lVar1 + 2] = local_60[lVar1] + local_38.m_data.m_data[3].m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_58 = 0x100000000;
  local_50 = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[(int)local_60[lVar1]] = local_88[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}